

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
LabelSinglePropertyState<false>::Float
          (LabelSinglePropertyState<false> *this,Context<false> *ctx,float v)

{
  BaseState<false> *pBVar1;
  
  ctx->key = ctx->key + 7;
  ctx->key_length = ctx->key_length - 7;
  pBVar1 = LabelObjectState<false>::Float(&ctx->label_object_state,ctx,v);
  if (pBVar1 != (BaseState<false> *)0x0) {
    pBVar1 = ctx->previous_state;
  }
  return pBVar1;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Float(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }